

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

List<Path> * __thiscall
Path::files(List<Path> *__return_storage_ptr__,Path *this,uint filter,size_t max,bool recurse)

{
  anon_class_32_4_359d818e local_70;
  function<Path::VisitResult_(const_Path_&)> local_50;
  undefined1 local_2a;
  byte local_29;
  size_t sStack_28;
  bool recurse_local;
  size_t max_local;
  Path *pPStack_18;
  uint filter_local;
  Path *this_local;
  List<Path> *paths;
  
  local_29 = recurse;
  sStack_28 = max;
  max_local._4_4_ = filter;
  pPStack_18 = this;
  this_local = (Path *)__return_storage_ptr__;
  if (max == 0) {
    __assert_fail("max != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Path.cpp",
                  0x311,"List<Path> Path::files(unsigned int, size_t, bool) const");
  }
  local_2a = 0;
  List<Path>::List(__return_storage_ptr__);
  local_70.filter = max_local._4_4_;
  local_70.max = &stack0xffffffffffffffd8;
  local_70.recurse = (bool)(local_29 & 1);
  local_70.paths = __return_storage_ptr__;
  std::function<Path::VisitResult(Path_const&)>::
  function<Path::files(unsigned_int,unsigned_long,bool)const::__0,void>
            ((function<Path::VisitResult(Path_const&)> *)&local_50,&local_70);
  visit(this,&local_50);
  std::function<Path::VisitResult_(const_Path_&)>::~function(&local_50);
  return __return_storage_ptr__;
}

Assistant:

List<Path> Path::files(unsigned int filter, size_t max, bool recurse) const
{
    assert(max != 0);

    List<Path> paths;
    visit([filter, &max, recurse, &paths](const Path &path) {
            if (max > 0)
                --max;
            if (path.type() & filter) {
                paths.append(path);
            }
            if (!max)
                return Path::Abort;
            return recurse ? Path::Recurse : Path::Continue;
        });
    return paths;
}